

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void walEncodeFrame(Wal *pWal,u32 iPage,u32 nTruncate,u8 *aData,u8 *aFrame)

{
  u32 *aIn;
  uint uVar1;
  
  *(u32 *)aFrame = iPage >> 0x18 | (iPage & 0xff0000) >> 8 | (iPage & 0xff00) << 8 | iPage << 0x18;
  *(u32 *)(aFrame + 4) =
       nTruncate >> 0x18 | (nTruncate & 0xff0000) >> 8 | (nTruncate & 0xff00) << 8 |
       nTruncate << 0x18;
  if (pWal->iReCksum == 0) {
    aIn = (pWal->hdr).aFrameCksum;
    *(undefined8 *)(aFrame + 8) = *(undefined8 *)(pWal->hdr).aSalt;
    uVar1 = (uint)((pWal->hdr).bigEndCksum == '\0');
    walChecksumBytes(uVar1,aFrame,8,aIn,aIn);
    walChecksumBytes(uVar1,aData,pWal->szPage,aIn,aIn);
    uVar1 = (pWal->hdr).aFrameCksum[0];
    *(uint *)(aFrame + 0x10) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (pWal->hdr).aFrameCksum[1];
    *(uint *)(aFrame + 0x14) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  else {
    aFrame[8] = '\0';
    aFrame[9] = '\0';
    aFrame[10] = '\0';
    aFrame[0xb] = '\0';
    aFrame[0xc] = '\0';
    aFrame[0xd] = '\0';
    aFrame[0xe] = '\0';
    aFrame[0xf] = '\0';
    aFrame[0x10] = '\0';
    aFrame[0x11] = '\0';
    aFrame[0x12] = '\0';
    aFrame[0x13] = '\0';
    aFrame[0x14] = '\0';
    aFrame[0x15] = '\0';
    aFrame[0x16] = '\0';
    aFrame[0x17] = '\0';
  }
  return;
}

Assistant:

static void walEncodeFrame(
  Wal *pWal,                      /* The write-ahead log */
  u32 iPage,                      /* Database page number for frame */
  u32 nTruncate,                  /* New db size (or 0 for non-commit frames) */
  u8 *aData,                      /* Pointer to page data */
  u8 *aFrame                      /* OUT: Write encoded frame here */
){
  int nativeCksum;                /* True for native byte-order checksums */
  u32 *aCksum = pWal->hdr.aFrameCksum;
  assert( WAL_FRAME_HDRSIZE==24 );
  sqlite3Put4byte(&aFrame[0], iPage);
  sqlite3Put4byte(&aFrame[4], nTruncate);
  if( pWal->iReCksum==0 ){
    memcpy(&aFrame[8], pWal->hdr.aSalt, 8);

    nativeCksum = (pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN);
    walChecksumBytes(nativeCksum, aFrame, 8, aCksum, aCksum);
    walChecksumBytes(nativeCksum, aData, pWal->szPage, aCksum, aCksum);

    sqlite3Put4byte(&aFrame[16], aCksum[0]);
    sqlite3Put4byte(&aFrame[20], aCksum[1]);
  }else{
    memset(&aFrame[8], 0, 16);
  }
}